

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O2

Rtm_Man_t * Rtm_ManFromAig(Aig_Man_t *p)

{
  Aig_Obj_t *pAVar1;
  Rtm_Man_t *pRtm;
  Rtm_Obj_t *pRVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  
  if (p->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRet.c"
                  ,0x2a8,"Rtm_Man_t *Rtm_ManFromAig(Aig_Man_t *)");
  }
  if (p->nObjs[4] == 0) {
    pRtm = Rtm_ManAlloc(p);
    pAVar1 = p->pConst1;
    pRVar2 = Rtm_ObjAlloc(pRtm,0,*(uint *)&pAVar1->field_0x18 >> 6);
    (pAVar1->field_5).pData = pRVar2;
    for (iVar5 = 0; iVar6 = p->nRegs, iVar5 < p->nObjs[2] - iVar6; iVar5 = iVar5 + 1) {
      pvVar3 = Vec_PtrEntry(p->vCis,iVar5);
      pRVar2 = Rtm_ObjAlloc(pRtm,0,*(uint *)((long)pvVar3 + 0x18) >> 6);
      *(Rtm_Obj_t **)((long)pvVar3 + 0x28) = pRVar2;
      Vec_PtrPush(pRtm->vPis,pRVar2);
    }
    for (iVar5 = 0; iVar5 < p->nObjs[3] - iVar6; iVar5 = iVar5 + 1) {
      pvVar3 = Vec_PtrEntry(p->vCos,iVar5);
      pRVar2 = Rtm_ObjAlloc(pRtm,1,0);
      *(Rtm_Obj_t **)((long)pvVar3 + 0x28) = pRVar2;
      Vec_PtrPush(pRtm->vPos,pRVar2);
      iVar6 = p->nRegs;
    }
    for (iVar6 = p->nObjs[2] - iVar6; iVar6 < p->vCis->nSize; iVar6 = iVar6 + 1) {
      pvVar3 = Vec_PtrEntry(p->vCis,iVar6);
      pRVar2 = Rtm_ObjAlloc(pRtm,1,*(uint *)((long)pvVar3 + 0x18) >> 6);
      *(Rtm_Obj_t **)((long)pvVar3 + 0x28) = pRVar2;
    }
    for (iVar5 = p->nObjs[3] - p->nRegs; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
      pvVar3 = Vec_PtrEntry(p->vCos,iVar5);
      pRVar2 = Rtm_ObjAlloc(pRtm,1,1);
      *(Rtm_Obj_t **)((long)pvVar3 + 0x28) = pRVar2;
    }
    for (iVar5 = 0; iVar5 < p->vObjs->nSize; iVar5 = iVar5 + 1) {
      pvVar3 = Vec_PtrEntry(p->vObjs,iVar5);
      if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
        pRVar2 = Rtm_ObjAlloc(pRtm,2,*(uint *)((long)pvVar3 + 0x18) >> 6);
        *(Rtm_Obj_t **)((long)pvVar3 + 0x28) = pRVar2;
      }
    }
    for (iVar5 = 0; iVar6 = p->nObjs[3] - p->nRegs, iVar5 < iVar6; iVar5 = iVar5 + 1) {
      pvVar3 = Vec_PtrEntry(p->vCos,iVar5);
      Rtm_ObjAddFanin(*(Rtm_Obj_t **)((long)pvVar3 + 0x28),
                      *(Rtm_Obj_t **)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x28),
                      (uint)*(ulong *)((long)pvVar3 + 8) & 1);
    }
    for (; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1) {
      pvVar3 = Vec_PtrEntry(p->vCos,iVar6);
      Rtm_ObjAddFanin(*(Rtm_Obj_t **)((long)pvVar3 + 0x28),
                      *(Rtm_Obj_t **)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x28),
                      (uint)*(ulong *)((long)pvVar3 + 8) & 1);
    }
    for (iVar5 = 0; iVar5 < p->nRegs; iVar5 = iVar5 + 1) {
      pvVar3 = Vec_PtrEntry(p->vCos,(p->nObjs[3] - p->nRegs) + iVar5);
      pvVar4 = Vec_PtrEntry(p->vCis,(p->nObjs[2] - p->nRegs) + iVar5);
      Rtm_ObjAddFanin(*(Rtm_Obj_t **)((long)pvVar4 + 0x28),*(Rtm_Obj_t **)((long)pvVar3 + 0x28),0);
    }
    for (iVar5 = 0; iVar5 < p->vObjs->nSize; iVar5 = iVar5 + 1) {
      pvVar3 = Vec_PtrEntry(p->vObjs,iVar5);
      if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
        Rtm_ObjAddFanin(*(Rtm_Obj_t **)((long)pvVar3 + 0x28),
                        *(Rtm_Obj_t **)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x28),
                        (uint)*(ulong *)((long)pvVar3 + 8) & 1);
        Rtm_ObjAddFanin(*(Rtm_Obj_t **)((long)pvVar3 + 0x28),
                        *(Rtm_Obj_t **)
                         ((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x28),
                        (uint)*(ulong *)((long)pvVar3 + 0x10) & 1);
      }
    }
    return pRtm;
  }
  __assert_fail("Aig_ManBufNum(p) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRet.c"
                ,0x2a9,"Rtm_Man_t *Rtm_ManFromAig(Aig_Man_t *)");
}

Assistant:

Rtm_Man_t * Rtm_ManFromAig( Aig_Man_t * p )
{
    Rtm_Man_t * pRtm;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
    assert( Aig_ManRegNum(p) > 0 );
    assert( Aig_ManBufNum(p) == 0 );
    // allocate the manager
    pRtm = Rtm_ManAlloc( p );
    // allocate objects
    pObj = Aig_ManConst1(p);
    pObj->pData = Rtm_ObjAlloc( pRtm, 0, pObj->nRefs );
    Aig_ManForEachPiSeq( p, pObj, i )
    {
        pObj->pData = Rtm_ObjAlloc( pRtm, 0, pObj->nRefs );
        Vec_PtrPush( pRtm->vPis, pObj->pData );
    }
    Aig_ManForEachPoSeq( p, pObj, i )
    {
        pObj->pData = Rtm_ObjAlloc( pRtm, 1, 0 );
        Vec_PtrPush( pRtm->vPos, pObj->pData );
    }
    Aig_ManForEachLoSeq( p, pObj, i )
        pObj->pData = Rtm_ObjAlloc( pRtm, 1, pObj->nRefs );
    Aig_ManForEachLiSeq( p, pObj, i )
        pObj->pData = Rtm_ObjAlloc( pRtm, 1, 1 );
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Rtm_ObjAlloc( pRtm, 2, pObj->nRefs );
    // connect objects
    Aig_ManForEachPoSeq( p, pObj, i )
        Rtm_ObjAddFanin( (Rtm_Obj_t *)pObj->pData, (Rtm_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
    Aig_ManForEachLiSeq( p, pObj, i )
        Rtm_ObjAddFanin( (Rtm_Obj_t *)pObj->pData, (Rtm_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        Rtm_ObjAddFanin( (Rtm_Obj_t *)pObjLo->pData, (Rtm_Obj_t *)pObjLi->pData, 0 );
    Aig_ManForEachNode( p, pObj, i )
    {
        Rtm_ObjAddFanin( (Rtm_Obj_t *)pObj->pData, (Rtm_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        Rtm_ObjAddFanin( (Rtm_Obj_t *)pObj->pData, (Rtm_Obj_t *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
    }
    return pRtm;
}